

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getters-setters.c
# Opt level: O2

int run_test_getters_setters(void)

{
  int iVar1;
  uv_handle_type uVar2;
  uv_fs_type uVar3;
  size_t sVar4;
  uv_loop_t *loop;
  int *piVar5;
  uv_pipe_t *handle;
  uv_loop_t *puVar6;
  uv_fs_t *req;
  ssize_t sVar7;
  uv_stat_t *puVar8;
  uv_stat_t *puVar9;
  char *pcVar10;
  undefined8 uStack_30;
  
  sVar4 = uv_loop_size();
  loop = (uv_loop_t *)malloc(sVar4);
  if (loop == (uv_loop_t *)0x0) {
    pcVar10 = "loop != NULL";
    uStack_30 = 0x28;
  }
  else {
    iVar1 = uv_loop_init(loop);
    if (iVar1 == 0) {
      uv_loop_set_data(loop,&cookie1);
      if ((int *)loop->data == &cookie1) {
        piVar5 = (int *)uv_loop_get_data(loop);
        if (piVar5 == &cookie1) {
          sVar4 = uv_handle_size(UV_NAMED_PIPE);
          handle = (uv_pipe_t *)malloc(sVar4);
          uv_pipe_init(loop,handle,0);
          uVar2 = uv_handle_get_type((uv_handle_t *)handle);
          if (uVar2 == UV_NAMED_PIPE) {
            puVar6 = uv_handle_get_loop((uv_handle_t *)handle);
            if (puVar6 == loop) {
              handle->data = &cookie2;
              piVar5 = (int *)uv_handle_get_data((uv_handle_t *)handle);
              if (piVar5 == &cookie2) {
                uv_handle_set_data((uv_handle_t *)handle,&cookie1);
                piVar5 = (int *)uv_handle_get_data((uv_handle_t *)handle);
                if (piVar5 == &cookie1) {
                  if ((int *)handle->data == &cookie1) {
                    sVar4 = uv_stream_get_write_queue_size((uv_stream_t *)handle);
                    if (sVar4 == 0) {
                      handle->write_queue_size = handle->write_queue_size + 1;
                      sVar4 = uv_stream_get_write_queue_size((uv_stream_t *)handle);
                      if (sVar4 == 1) {
                        handle->write_queue_size = handle->write_queue_size - 1;
                        uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
                        iVar1 = uv_run(loop,UV_RUN_DEFAULT);
                        if (iVar1 == 0) {
                          sVar4 = uv_req_size(UV_FS);
                          req = (uv_fs_t *)malloc(sVar4);
                          uv_fs_stat(loop,req,".",(uv_fs_cb)0x0);
                          iVar1 = uv_run(loop,UV_RUN_DEFAULT);
                          if (iVar1 == 0) {
                            uVar3 = uv_fs_get_type(req);
                            if (uVar3 == UV_FS_STAT) {
                              sVar7 = uv_fs_get_result(req);
                              if (sVar7 == 0) {
                                puVar8 = (uv_stat_t *)uv_fs_get_ptr(req);
                                puVar9 = uv_fs_get_statbuf(req);
                                if (puVar8 == puVar9) {
                                  puVar8 = uv_fs_get_statbuf(req);
                                  if ((puVar8->st_mode & 0x4000) == 0) {
                                    pcVar10 = "uv_fs_get_statbuf(fs)->st_mode & S_IFDIR";
                                    uStack_30 = 0x4d;
                                  }
                                  else {
                                    pcVar10 = uv_fs_get_path(req);
                                    if ((*pcVar10 == '.') && (pcVar10[1] == '\0')) {
                                      uv_fs_req_cleanup(req);
                                      iVar1 = uv_loop_close(loop);
                                      if (iVar1 == 0) {
                                        free(handle);
                                        free(req);
                                        free(loop);
                                        return 0;
                                      }
                                      pcVar10 = "r == 0";
                                      uStack_30 = 0x52;
                                    }
                                    else {
                                      pcVar10 = "strcmp(uv_fs_get_path(fs), \".\") == 0";
                                      uStack_30 = 0x4e;
                                    }
                                  }
                                }
                                else {
                                  pcVar10 = "uv_fs_get_ptr(fs) == uv_fs_get_statbuf(fs)";
                                  uStack_30 = 0x4c;
                                }
                              }
                              else {
                                pcVar10 = "uv_fs_get_result(fs) == 0";
                                uStack_30 = 0x4b;
                              }
                            }
                            else {
                              pcVar10 = "uv_fs_get_type(fs) == UV_FS_STAT";
                              uStack_30 = 0x4a;
                            }
                          }
                          else {
                            pcVar10 = "r == 0";
                            uStack_30 = 0x48;
                          }
                        }
                        else {
                          pcVar10 = "r == 0";
                          uStack_30 = 0x42;
                        }
                      }
                      else {
                        pcVar10 = "uv_stream_get_write_queue_size((uv_stream_t*)pipe) == 1";
                        uStack_30 = 0x3d;
                      }
                    }
                    else {
                      pcVar10 = "uv_stream_get_write_queue_size((uv_stream_t*)pipe) == 0";
                      uStack_30 = 0x3b;
                    }
                  }
                  else {
                    pcVar10 = "pipe->data == &cookie1";
                    uStack_30 = 0x39;
                  }
                }
                else {
                  pcVar10 = "uv_handle_get_data((uv_handle_t*)pipe) == &cookie1";
                  uStack_30 = 0x38;
                }
              }
              else {
                pcVar10 = "uv_handle_get_data((uv_handle_t*)pipe) == &cookie2";
                uStack_30 = 0x36;
              }
            }
            else {
              pcVar10 = "uv_handle_get_loop((uv_handle_t*)pipe) == loop";
              uStack_30 = 0x34;
            }
          }
          else {
            pcVar10 = "uv_handle_get_type((uv_handle_t*)pipe) == UV_NAMED_PIPE";
            uStack_30 = 0x32;
          }
        }
        else {
          pcVar10 = "uv_loop_get_data(loop) == &cookie1";
          uStack_30 = 0x2e;
        }
      }
      else {
        pcVar10 = "loop->data == &cookie1";
        uStack_30 = 0x2d;
      }
    }
    else {
      pcVar10 = "r == 0";
      uStack_30 = 0x2a;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getters-setters.c"
          ,uStack_30,pcVar10);
  abort();
}

Assistant:

TEST_IMPL(getters_setters) {
  uv_loop_t* loop;
  uv_pipe_t* pipe;
  uv_fs_t* fs;
  int r;

  loop = malloc(uv_loop_size());
  ASSERT(loop != NULL);
  r = uv_loop_init(loop);
  ASSERT(r == 0);

  uv_loop_set_data(loop, &cookie1);
  ASSERT(loop->data == &cookie1);
  ASSERT(uv_loop_get_data(loop) == &cookie1);

  pipe = malloc(uv_handle_size(UV_NAMED_PIPE));
  r = uv_pipe_init(loop, pipe, 0);
  ASSERT(uv_handle_get_type((uv_handle_t*)pipe) == UV_NAMED_PIPE);

  ASSERT(uv_handle_get_loop((uv_handle_t*)pipe) == loop);
  pipe->data = &cookie2;
  ASSERT(uv_handle_get_data((uv_handle_t*)pipe) == &cookie2);
  uv_handle_set_data((uv_handle_t*)pipe, &cookie1);
  ASSERT(uv_handle_get_data((uv_handle_t*)pipe) == &cookie1);
  ASSERT(pipe->data == &cookie1);

  ASSERT(uv_stream_get_write_queue_size((uv_stream_t*)pipe) == 0);
  pipe->write_queue_size++;
  ASSERT(uv_stream_get_write_queue_size((uv_stream_t*)pipe) == 1);
  pipe->write_queue_size--;
  uv_close((uv_handle_t*)pipe, NULL);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  fs = malloc(uv_req_size(UV_FS));
  uv_fs_stat(loop, fs, ".", NULL);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(uv_fs_get_type(fs) == UV_FS_STAT);
  ASSERT(uv_fs_get_result(fs) == 0);
  ASSERT(uv_fs_get_ptr(fs) == uv_fs_get_statbuf(fs));
  ASSERT(uv_fs_get_statbuf(fs)->st_mode & S_IFDIR);
  ASSERT(strcmp(uv_fs_get_path(fs), ".") == 0);
  uv_fs_req_cleanup(fs);

  r = uv_loop_close(loop);
  ASSERT(r == 0);

  free(pipe);
  free(fs);
  free(loop);
  return 0;
}